

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Divide<1,_0,_1>::propagate(Divide<1,_0,_1> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  IntVar *pIVar13;
  IntVar *pIVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  pIVar14 = (this->x).var;
  pIVar13 = (this->y).var;
  iVar5 = (pIVar14->min).v;
  lVar15 = (long)(pIVar13->min).v;
  lVar17 = (long)(pIVar13->max).v;
  pIVar13 = (this->z).var;
  iVar1 = (pIVar13->max).v;
  lVar12 = -(long)iVar1;
  iVar2 = (pIVar13->min).v;
  lVar16 = -(long)iVar2;
  uVar8 = ~(long)(pIVar14->max).v;
  lVar6 = (long)(uVar8 + lVar17) / lVar17;
  lVar7 = lVar16;
  if (lVar6 != lVar12 && SBORROW8(lVar6,lVar12) == lVar6 + iVar1 < 0) {
    if (so.lazy) {
      iVar3 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[9])(pIVar14);
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar9 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
      pIVar13 = (this->z).var;
    }
    else {
      uVar9 = 0;
    }
    iVar3 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])(pIVar13,-lVar6,uVar9,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
    pIVar13 = (this->z).var;
    lVar7 = -(long)(pIVar13->min).v;
  }
  lVar11 = -(long)iVar5;
  lVar6 = (lVar15 + lVar11 + -1) / lVar15;
  if (lVar6 < lVar7) {
    if (so.lazy == true) {
      iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar9 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar13 = (this->z).var;
    }
    else {
      uVar9 = 0;
    }
    iVar5 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])(pIVar13,-lVar6,uVar9,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  uVar9 = lVar15 * (lVar12 + -1);
  pIVar14 = (this->x).var;
  lVar7 = (long)(pIVar14->max).v;
  if (SBORROW8(uVar9,-lVar7) == (long)(uVar9 + lVar7) < 0) {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar14 = (this->x).var;
    }
    else {
      uVar10 = 0;
    }
    iVar5 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xf])(pIVar14,~uVar9,uVar10,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
    pIVar14 = (this->x).var;
  }
  lVar17 = lVar17 * lVar16;
  lVar7 = (long)(pIVar14->min).v;
  if (SBORROW8(lVar17,-lVar7) != lVar17 + lVar7 < 0) {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar9 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar14 = (this->x).var;
    }
    else {
      uVar9 = 0;
    }
    iVar5 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xe])(pIVar14,-lVar17,uVar9,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  if (iVar2 < 0) {
    lVar16 = (long)(uVar8 + lVar16) / lVar16;
    pIVar14 = (this->y).var;
    if ((pIVar14->min).v < lVar16) {
      if (so.lazy == true) {
        iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
        pIVar14 = (this->y).var;
      }
      else {
        uVar8 = 0;
      }
      iVar5 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xe])(pIVar14,lVar16,uVar8,1);
      if ((char)iVar5 == '\0') {
        return false;
      }
    }
  }
  if (-2 < iVar1) {
    return true;
  }
  lVar7 = (lVar11 + lVar12 + -2) / (lVar12 + -1);
  pIVar14 = (this->y).var;
  if (lVar7 <= (pIVar14->max).v) {
    if (so.lazy == true) {
      iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar14 = (this->y).var;
    }
    else {
      uVar8 = 0;
    }
    iVar5 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xf])(pIVar14,lVar7 + -1,uVar8,1)
    ;
    if ((char)iVar5 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}